

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall Raytracer::Image::~Image(Image *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->height;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->datas[lVar2] != (RGB *)0x0) {
        operator_delete__(this->datas[lVar2]);
        iVar1 = this->height;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->datas != (RGB **)0x0) {
    operator_delete__(this->datas);
    return;
  }
  return;
}

Assistant:

Raytracer::Image::~Image() {
    for(int y = 0;y<height;y++){
        delete[] datas[y];
    }
    delete[] datas;
}